

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_dist.cpp
# Opt level: O2

Read<int> __thiscall Omega_h::Dist::exch<int>(Dist *this,Read<int> *data,Int width)

{
  Alloc *sendbuf_dev;
  Int in_ECX;
  undefined4 in_register_00000014;
  Write<int> *this_00;
  void *extraout_RDX;
  Read<int> RVar1;
  ScopedTimer omega_h_scoped_function_timer;
  allocator local_149;
  undefined1 local_148 [64];
  Write<int> local_108;
  Write<int> local_f8;
  Write<int> local_e8;
  Write<int> local_d8;
  Write<int> local_c8;
  Write<int> local_b8;
  Write<int> local_a8;
  Write<int> local_98;
  ScopedTimer exch_timer;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = (Write<int> *)CONCAT44(in_register_00000014,width);
  std::__cxx11::string::string
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_dist.cpp"
             ,&local_149);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exch_timer,
                 &local_48,":");
  std::__cxx11::to_string(&local_68,0x6e);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exch_timer,
                 &local_68);
  begin_code("exch",(char *)local_148._0_8_);
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&exch_timer);
  std::__cxx11::string::~string((string *)&local_48);
  begin_code("Dist::exch",(char *)0x0);
  if (data[1].write_.shared_alloc_.direct_ptr != (void *)0x0) {
    Write<int>::Write(&local_98,this_00);
    Write<int>::Write(&local_a8,&data[1].write_);
    expand<int>((Omega_h *)local_148,(Read<int> *)&local_98,(LOs *)&local_a8,in_ECX);
    Write<int>::operator=(this_00,(Write<int> *)local_148);
    Write<int>::~Write((Write<int> *)local_148);
    Write<int>::~Write(&local_a8);
    Write<int>::~Write(&local_98);
  }
  if (data[3].write_.shared_alloc_.direct_ptr != (void *)0x0) {
    Write<int>::Write(&local_b8,this_00);
    Write<int>::Write(&local_c8,&data[3].write_);
    permute<int>((Omega_h *)local_148,(Read<int> *)&local_b8,(LOs *)&local_c8,in_ECX);
    Write<int>::operator=(this_00,(Write<int> *)local_148);
    Write<int>::~Write((Write<int> *)local_148);
    Write<int>::~Write(&local_c8);
    Write<int>::~Write(&local_b8);
  }
  sendbuf_dev = data[7].write_.shared_alloc_.alloc;
  Write<int>::Write(&local_d8,this_00);
  Write<int>::Write(&local_e8,&data[5].write_);
  Write<int>::Write(&local_f8,&data[6].write_);
  Comm::alltoallv<int>
            ((Comm *)local_148,(Read<int> *)sendbuf_dev,(Read<int> *)&local_d8,
             (Read<int> *)&local_e8,(Int)&local_f8);
  Write<int>::operator=(this_00,(Write<int> *)local_148);
  Write<int>::~Write((Write<int> *)local_148);
  Write<int>::~Write(&local_f8);
  Write<int>::~Write(&local_e8);
  Write<int>::~Write(&local_d8);
  if (data[4].write_.shared_alloc_.direct_ptr != (void *)0x0) {
    Write<int>::Write((Write<int> *)(local_148 + 0x30),&data[4].write_);
    Write<int>::Write((Write<int> *)(local_148 + 0x20),this_00);
    unmap<int>((Omega_h *)&local_108,(LOs *)(local_148 + 0x30),(Read<int> *)(local_148 + 0x20),
               in_ECX);
    Read<int>::Read((Read<signed_char> *)local_148,&local_108);
    Write<int>::operator=(this_00,(Write<int> *)local_148);
    Write<int>::~Write((Write<int> *)local_148);
    Write<int>::~Write(&local_108);
    Write<int>::~Write((Write<int> *)(local_148 + 0x20));
    Write<int>::~Write((Write<int> *)(local_148 + 0x30));
  }
  Write<int>::Write((Write<int> *)this,this_00);
  ScopedTimer::~ScopedTimer(&exch_timer);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> Dist::exch(Read<T> data, Int width) const {
  OMEGA_H_TIME_FUNCTION;
  ScopedTimer exch_timer("Dist::exch");
  if (roots2items_[F].exists()) {
    data = expand(data, roots2items_[F], width);
  }
  if (items2content_[F].exists()) {
    data = permute(data, items2content_[F], width);
  }
  data = comm_[F]->alltoallv(data, msgs2content_[F], msgs2content_[R], width);
  if (items2content_[R].exists()) {
    data = unmap(items2content_[R], data, width);
  }
  return data;
}